

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  cmMessenger *pcVar1;
  bool bVar2;
  bool local_f1;
  undefined1 local_f0 [8];
  cmListFileParser parser;
  bool parseError;
  allocator local_51;
  string local_50;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *lfbt_local;
  cmMessenger *messenger_local;
  char *filename_local;
  cmListFile *this_local;
  
  local_30 = lfbt;
  lfbt_local = (cmListFileBacktrace *)messenger;
  messenger_local = (cmMessenger *)filename;
  filename_local = (char *)this;
  bVar2 = cmsys::SystemTools::FileExists(filename);
  pcVar1 = messenger_local;
  parser.Separation._3_1_ = SeparationOkay >> 0x18;
  local_f1 = true;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,(char *)pcVar1,&local_51);
    parser.Separation._3_1_ = 1;
    local_f1 = cmsys::SystemTools::FileIsDirectory(&local_50);
  }
  if ((parser.Separation._3_1_ & 1) != SeparationOkay >> 0x18) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  if (local_f1 == false) {
    parser.Separation._2_1_ = SeparationOkay >> 0x10;
    cmListFileParser::cmListFileParser
              ((cmListFileParser *)local_f0,this,local_30,(cmMessenger *)lfbt_local,
               (char *)messenger_local);
    bVar2 = cmListFileParser::ParseFile((cmListFileParser *)local_f0);
    parser.Separation._2_1_ = (bVar2 ^ 0xff) & 1;
    cmListFileParser::~cmListFileParser((cmListFileParser *)local_f0);
    this_local._7_1_ = (bool)((parser.Separation._2_1_ ^ 0xff) & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}